

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O2

int readbits(int bitwidth,readblock_crap *crap)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  
  uVar2 = 0;
  if (crap->sourcepos < crap->sourceend) {
    iVar6 = crap->rembits;
    uVar2 = 0;
    iVar3 = 0;
    pbVar1 = crap->sourcepos;
    while( true ) {
      pbVar5 = pbVar1 + 1;
      iVar4 = bitwidth - iVar6;
      if (iVar4 == 0 || bitwidth < iVar6) break;
      crap->sourcepos = pbVar5;
      uVar2 = uVar2 | (uint)*pbVar1 << ((byte)iVar3 & 0x1f);
      if (crap->sourceend <= pbVar5) {
        return uVar2;
      }
      iVar3 = iVar3 + iVar6;
      crap->rembits = 8;
      iVar6 = 8;
      pbVar1 = pbVar5;
      bitwidth = iVar4;
    }
    uVar2 = uVar2 | (~(-1 << ((byte)bitwidth & 0x1f)) & (uint)*pbVar1) << ((byte)iVar3 & 0x1f);
    *pbVar1 = *pbVar1 >> ((byte)bitwidth & 0x1f);
    crap->rembits = crap->rembits - bitwidth;
  }
  return uVar2;
}

Assistant:

static int readbits(int bitwidth, readblock_crap * crap)
{
	int val = 0;
	int b = 0;

	if (crap->sourcepos >= crap->sourceend) return val;

	while (bitwidth > crap->rembits) {
		val |= *crap->sourcepos++ << b;
		if (crap->sourcepos >= crap->sourceend) return val;
		b += crap->rembits;
		bitwidth -= crap->rembits;
		crap->rembits = 8;
	}

	val |= (*crap->sourcepos & ((1 << bitwidth) - 1)) << b;
	*crap->sourcepos >>= bitwidth;
	crap->rembits -= bitwidth;

	return val;
}